

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

bytes * hexStringToBytes(bytes *__return_storage_ptr__,string *_s)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool local_37;
  value_type_conflict local_35;
  uint local_34;
  value_type_conflict local_2d;
  uint i;
  undefined1 local_1d;
  uint local_1c;
  string *psStack_18;
  uint s;
  string *_s_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *ret;
  
  psStack_18 = _s;
  _s_local = (string *)__return_storage_ptr__;
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)_s);
  local_37 = false;
  if (*pcVar3 == '0') {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
    local_37 = *pcVar3 == 'x';
  }
  local_1c = (uint)local_37 * 2;
  local_1d = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
  lVar4 = std::__cxx11::string::size();
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
            (__return_storage_ptr__,(lVar4 - (ulong)local_1c) + 1 >> 1);
  uVar5 = std::__cxx11::string::size();
  if ((uVar5 & 1) != 0) {
    local_1c = local_1c + 1;
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
    iVar1 = fromHex(*pcVar3);
    local_2d = (value_type_conflict)iVar1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_2d);
  }
  for (local_34 = local_1c; uVar5 = (ulong)local_34, uVar6 = std::__cxx11::string::size(),
      uVar5 < uVar6; local_34 = local_34 + 2) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
    iVar1 = fromHex(*pcVar3);
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)psStack_18);
    iVar2 = fromHex(*pcVar3);
    local_35 = (char)(iVar1 << 4) + (char)iVar2;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (__return_storage_ptr__,&local_35);
  }
  return __return_storage_ptr__;
}

Assistant:

bytes hexStringToBytes(std::string const& _s)
{
	unsigned s = (_s[0] == '0' && _s[1] == 'x') ? 2 : 0;
	std::vector<uint8_t> ret;
	ret.reserve((_s.size() - s + 1) / 2);

	if (_s.size() % 2)
		try
		{
			ret.push_back(fromHex(_s[s++]));
		}
		catch (...)
		{
			ret.push_back(0);
		}
	for (unsigned i = s; i < _s.size(); i += 2)
		try
		{
			ret.push_back((byte)(fromHex(_s[i]) * 16 + fromHex(_s[i + 1])));
		}
		catch (...){
			ret.push_back(0);
		}
	return ret;
}